

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_keeper.h
# Opt level: O2

void __thiscall mp::ConstraintManager::ConstraintManager(ConstraintManager *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->con_keepers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->con_keepers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->con_keepers_)._M_t._M_impl.super__Rb_tree_header;
  (this->con_keepers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->con_keepers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->con_keepers_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  MakeFileAppender();
  return;
}

Assistant:

void AddConstraintKeeper(BasicConstraintKeeper& ck, double priority) {
    auto insres = con_keepers_.insert( { priority, ck } );
    MP_ASSERT_ALWAYS(insres.second, "Duplicated constraint priority");
    ck.SetLogger(&*graph_exporter_app_);
  }